

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  locale *plVar5;
  basic_format_specs<char> *pbVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  numpunct *pnVar12;
  char *pcVar13;
  buffer_appender<char> bVar14;
  int iVar15;
  uint uVar16;
  long *plVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  char *pcVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  buffer<char> *buf;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *local_288;
  long local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar12 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar12 + 0x20))(&local_2a8,pnVar12);
  std::locale::~locale((locale *)&local_248);
  if (local_2a0 == 0) {
    on_dec(this);
    goto LAB_00153934;
  }
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar12 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  cVar9 = (**(code **)(*(long *)pnVar12 + 0x18))(pnVar12);
  std::locale::~locale((locale *)&local_248);
  if (cVar9 == '\0') {
    on_dec(this);
    goto LAB_00153934;
  }
  uVar16 = this->abs_value;
  uVar24 = 0x1f;
  if ((uVar16 | 1) != 0) {
    for (; (uVar16 | 1) >> uVar24 == 0; uVar24 = uVar24 - 1) {
    }
  }
  uVar4 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar24 * 2);
  bVar8 = uVar16 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new + (ulong)uVar4 * 4);
  uVar23 = (uint)uVar4 - (uint)bVar8;
  plVar17 = local_2a8;
  uVar24 = uVar23;
  uVar10 = uVar23;
  if (local_2a0 == 0) {
LAB_00153704:
    uVar11 = uVar10;
    uVar18 = uVar24;
    if (plVar17 == (long *)((long)local_2a8 + local_2a0)) goto LAB_0015370f;
  }
  else {
    uVar18 = uVar23 + (int)local_2a0;
    lVar21 = local_2a0;
    do {
      cVar2 = (char)*plVar17;
      uVar11 = uVar10 - (int)cVar2;
      if ((uVar11 == 0 || (int)uVar10 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_00153704;
      uVar24 = uVar24 + 1;
      plVar17 = (long *)((long)plVar17 + 1);
      lVar21 = lVar21 + -1;
      uVar10 = uVar11;
    } while (lVar21 != 0);
LAB_0015370f:
    uVar18 = (int)(uVar11 - 1) / (int)*(char *)((long)local_2a8 + local_2a0 + -1) + uVar18;
  }
  pcVar13 = local_278 + (int)uVar23;
  uVar24 = uVar16;
  if (99 < uVar16) {
    do {
      uVar16 = uVar24 / 100;
      *(undefined2 *)(pcVar13 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar24 % 100) * 2);
      pcVar13 = pcVar13 + -2;
      bVar7 = 9999 < uVar24;
      uVar24 = uVar24 / 100;
    } while (bVar7);
  }
  if (uVar16 < 10) {
    pcVar13[-1] = (byte)uVar16 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar13 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar16 * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001c1998;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar18 = uVar18 + this->prefix_size;
  uVar25 = (ulong)uVar18;
  if (500 < uVar18) {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar25);
  }
  pcVar13 = local_248.super_buffer<char>.ptr_;
  local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
  if (uVar25 <= local_248.super_buffer<char>.capacity_) {
    local_248.super_buffer<char>.size_ = uVar25;
  }
  local_280 = (long)(int)uVar18;
  pcVar22 = local_248.super_buffer<char>.ptr_ + local_280 + -1;
  if (1 < (int)uVar23) {
    uVar19 = (ulong)uVar23;
    iVar20 = ((uint)uVar4 - (uint)bVar8) + 1;
    iVar15 = 0;
    plVar17 = local_2a8;
    do {
      uVar19 = uVar19 - 1;
      pcVar1 = pcVar22 + -1;
      *pcVar22 = local_278[uVar19 & 0xffffffff];
      cVar2 = (char)*plVar17;
      if ('\0' < cVar2) {
        iVar15 = iVar15 + 1;
        if ((cVar2 != '\x7f') && (iVar15 % (int)cVar2 == 0)) {
          if ((long *)((long)plVar17 + 1) != (long *)((long)local_2a8 + local_2a0)) {
            iVar15 = 0;
            plVar17 = (long *)((long)plVar17 + 1);
          }
          pcVar22[-1] = cVar9;
          pcVar1 = pcVar22 + -2;
        }
      }
      pcVar22 = pcVar1;
      iVar20 = iVar20 + -1;
    } while (2 < iVar20);
  }
  *pcVar22 = local_278[0];
  if (this->prefix_size != 0) {
    pcVar22[-1] = '-';
  }
  pbVar6 = this->specs;
  uVar19 = 0;
  if (uVar25 <= (uint)pbVar6->width) {
    uVar19 = (uint)pbVar6->width - uVar25;
  }
  bVar14.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                   (ulong)((byte)pbVar6->field_0x9 & 0xf));
  local_288 = this;
  if (*(ulong *)((long)bVar14.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)bVar14.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
               0x10) + uVar25 + (pbVar6->fill).size_ * uVar19) {
    (*(code *)**(undefined8 **)
                bVar14.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (bVar14.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar25 = uVar19 >> (bVar3 & 0x3f);
  bVar14 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar14,uVar25,&pbVar6->fill);
  bVar14 = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                     (pcVar13,pcVar13 + local_280,bVar14);
  bVar14 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar14,uVar19 - uVar25,&pbVar6->fill);
  (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar14.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
  }
LAB_00153934:
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }